

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

bool __thiscall
ON_2dVector::Decompose(ON_2dVector *this,ON_2dVector *X,ON_2dVector *Y,double *a,double *b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  double m01;
  double pivot_ratio;
  double local_8;
  
  local_8 = 0.0;
  dVar1 = X->x;
  dVar2 = X->y;
  dVar3 = Y->x;
  dVar4 = Y->y;
  m01 = dVar1 * dVar3 + dVar2 * dVar4;
  iVar5 = ON_Solve2x2(dVar1 * dVar1 + dVar2 * dVar2,m01,dVar3 * dVar3 + dVar4 * dVar4,m01,
                      dVar1 * this->x + dVar2 * this->y,this->x * dVar3 + dVar4 * this->y,a,b,
                      &local_8);
  return iVar5 == 2;
}

Assistant:

bool ON_2dVector::Decompose( // Computes a, b such that this vector = a*X + b*Y
       //
       // If X,Y is known to be an orthonormal frame,
       // then a = V*X, b = V*Y will compute
       // the same result more quickly.
       const ON_2dVector& X,
       const ON_2dVector& Y,
       double* a,
       double* b
       ) const
{
  int rank;
  double pivot_ratio = 0.0;
  double XoY = X*Y;
  rank = ON_Solve2x2( X*X, XoY, Y*Y, XoY,
                    (*this)*X, (*this)*Y, 
                    a, b, &pivot_ratio );
  return (rank == 2) ? true : false;
}